

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void xLearn::AccMetric::acc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pred,size_t start_idx,size_t end_idx)

{
  undefined8 uVar1;
  bool bVar2;
  index_t iVar3;
  ostream *poVar4;
  size_t i;
  float fVar5;
  float fVar6;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (start_idx <= end_idx) {
    *true_pred = 0;
    iVar3 = 0;
    for (; end_idx != start_idx; start_idx = start_idx + 1) {
      uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)(pred->super__Vector_base<float,_std::allocator<float>_>)
                                           ._M_impl.super__Vector_impl_data._M_start[start_idx]),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar5 = (float)((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * -0x40800000);
      uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)(Y->super__Vector_base<float,_std::allocator<float>_>).
                                           _M_impl.super__Vector_impl_data._M_start[start_idx]),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar6 = (float)((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * -0x40800000);
      if ((fVar5 == fVar6) && (!NAN(fVar5) && !NAN(fVar6))) {
        iVar3 = iVar3 + 1;
        *true_pred = iVar3;
      }
    }
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"acc_accum_thread",&local_56);
  poVar4 = Logger::Start(ERR,&local_30,0x76,&local_50);
  poVar4 = std::operator<<(poVar4,"CHECK_GE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x76);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"end_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"start_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

static void acc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               index_t* true_pred,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pred = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label == r_label) {
        (*true_pred)++;
      }
    }
  }